

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O0

spv_result_t
anon_unknown.dwarf_49184::encodeImmediate
          (AssemblyContext *context,char *text,spv_instruction_t *pInst)

{
  char *this;
  bool bVar1;
  DiagnosticStream *pDVar2;
  size_t sVar3;
  byte *local_210;
  DiagnosticStream local_208;
  uint32_t local_2c;
  spv_instruction_t *psStack_28;
  uint32_t parse_result;
  spv_instruction_t *pInst_local;
  char *text_local;
  AssemblyContext *context_local;
  
  psStack_28 = pInst;
  pInst_local = (spv_instruction_t *)text;
  text_local = (char *)context;
  if (*text == '!') {
    bVar1 = spvtools::utils::ParseNumber<unsigned_int>(text + 1,&local_2c);
    if (bVar1) {
      spvtools::AssemblyContext::binaryEncodeU32((AssemblyContext *)text_local,local_2c,psStack_28);
      this = text_local;
      sVar3 = strlen((char *)pInst_local);
      spvtools::AssemblyContext::seekForward((AssemblyContext *)this,(uint32_t)sVar3);
      context_local._4_4_ = SPV_SUCCESS;
    }
    else {
      spvtools::AssemblyContext::diagnostic
                (&local_208,(AssemblyContext *)text_local,SPV_ERROR_INVALID_TEXT);
      pDVar2 = spvtools::DiagnosticStream::operator<<
                         (&local_208,(char (*) [29])"Invalid immediate integer: !");
      local_210 = (byte *)((long)&pInst_local->opcode + 1);
      pDVar2 = spvtools::DiagnosticStream::operator<<(pDVar2,(char **)&local_210);
      context_local._4_4_ = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
      spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
    }
    return context_local._4_4_;
  }
  __assert_fail("*text == \'!\'",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/text.cpp"
                ,0xa4,
                "spv_result_t (anonymous namespace)::encodeImmediate(spvtools::AssemblyContext *, const char *, spv_instruction_t *)"
               );
}

Assistant:

spv_result_t encodeImmediate(spvtools::AssemblyContext* context,
                             const char* text, spv_instruction_t* pInst) {
  assert(*text == '!');
  uint32_t parse_result;
  if (!spvtools::utils::ParseNumber(text + 1, &parse_result)) {
    return context->diagnostic(SPV_ERROR_INVALID_TEXT)
           << "Invalid immediate integer: !" << text + 1;
  }
  context->binaryEncodeU32(parse_result, pInst);
  context->seekForward(static_cast<uint32_t>(strlen(text)));
  return SPV_SUCCESS;
}